

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

DictionaryPrinter * __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::GetDictNum_abi_cxx11_
          (DictionaryPrinter *this,size_t index,size_t size)

{
  undefined8 in_RCX;
  allocator local_69;
  char local_68 [8];
  char buf [64];
  size_t size_local;
  size_t index_local;
  DictionaryPrinter *this_local;
  
  snprintf(local_68,0x40,"%lu of %lu",size,in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_68,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return this;
}

Assistant:

string GetDictNum(size_t index, size_t size) const {
    char buf[64];   // big enough for two ints
    snprintf(buf, sizeof(buf), "%" PRIuS " of %" PRIuS, index, size);
    return buf;
  }